

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

Token * __thiscall
qpdf::Tokenizer::readToken
          (Token *__return_storage_ptr__,Tokenizer *this,InputSource *input,string *context,
          bool allow_bad,size_t max_len)

{
  pointer pcVar1;
  int iVar2;
  QPDFExc *this_00;
  undefined4 extraout_var;
  qpdf_offset_t qVar3;
  char char_to_unread;
  bool unread_char;
  char local_72;
  bool local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  nextToken(this,input,(string *)input,max_len);
  __return_storage_ptr__->type = tt_bad;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->raw_value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->raw_value).field_2;
  (__return_storage_ptr__->raw_value)._M_string_length = 0;
  (__return_storage_ptr__->raw_value).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_message).field_2;
  (__return_storage_ptr__->error_message)._M_string_length = 0;
  (__return_storage_ptr__->error_message).field_2._M_local_buf[0] = '\0';
  getToken(this,__return_storage_ptr__,&local_71,&local_72);
  if (__return_storage_ptr__->type != tt_bad || allow_bad) {
    return __return_storage_ptr__;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  iVar2 = (*input->_vptr_InputSource[3])(input);
  if (context->_M_string_length == 0) {
    qVar3 = InputSource::getLastOffset(input);
    std::__cxx11::to_string(&local_70,qVar3);
    std::operator+(&local_50,"offset ",&local_70);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (context->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + context->_M_string_length);
  }
  qVar3 = InputSource::getLastOffset(input);
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar2),&local_50,qVar3
                   ,&__return_storage_ptr__->error_message);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFTokenizer::Token
Tokenizer::readToken(InputSource& input, std::string const& context, bool allow_bad, size_t max_len)
{
    nextToken(input, context, max_len);

    Token token;
    bool unread_char;
    char char_to_unread;
    getToken(token, unread_char, char_to_unread);

    if (token.getType() == tt::tt_bad) {
        if (allow_bad) {
            QTC::TC("qpdf", "QPDFTokenizer allowing bad token");
        } else {
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                input.getName(),
                context.empty() ? "offset " + std::to_string(input.getLastOffset()) : context,
                input.getLastOffset(),
                token.getErrorMessage());
        }
    }
    return token;
}